

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O0

istream * sc_dt::operator>>(istream *is,sc_string_old *s)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  void *pvVar4;
  long *in_RSI;
  istream *in_RDI;
  bool bVar5;
  char c;
  char *p;
  int i;
  int in_stack_ffffffffffffffbc;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  void *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffd7;
  char *local_28;
  int local_20;
  
  if (1 < *(int *)*in_RSI) {
    *(int *)*in_RSI = *(int *)*in_RSI + -1;
    in_stack_ffffffffffffffc8 = operator_new(0x10);
    sc_string_rep::sc_string_rep
              ((sc_string_rep *)
               CONCAT17(in_stack_ffffffffffffffc7,
                        CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
               in_stack_ffffffffffffffbc);
    *in_RSI = (long)in_stack_ffffffffffffffc8;
  }
  local_20 = 0;
  local_28 = *(char **)(*in_RSI + 8);
  do {
    plVar3 = (long *)std::istream::get((char *)in_RDI);
    pvVar4 = std::ios::operator_cast_to_void_((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    bVar5 = false;
    if (pvVar4 != (void *)0x0) {
      iVar1 = isspace((int)in_stack_ffffffffffffffd7);
      bVar5 = iVar1 != 0;
    }
  } while (bVar5);
  while( true ) {
    uVar2 = std::ios::good();
    bVar5 = false;
    if ((uVar2 & 1) != 0) {
      iVar1 = isspace((int)in_stack_ffffffffffffffd7);
      bVar5 = iVar1 == 0;
    }
    if (!bVar5) break;
    if (*(int *)(*in_RSI + 4) + -2 < local_20) {
      *(undefined1 *)(*(long *)(*in_RSI + 8) + (long)local_20) = 0;
      sc_string_rep::resize
                ((sc_string_rep *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                 (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      local_28 = (char *)(*(long *)(*in_RSI + 8) + (long)local_20);
    }
    *local_28 = in_stack_ffffffffffffffd7;
    local_20 = local_20 + 1;
    std::istream::get((char *)in_RDI);
    local_28 = local_28 + 1;
  }
  *local_28 = '\0';
  return in_RDI;
}

Assistant:

::std::istream&
operator >> ( ::std::istream& is, sc_string_old& s )
{
    if( s.rep->ref_count > 1 ) {
        -- s.rep->ref_count;
        s.rep = new sc_string_rep;
    }

    int i = 0;
    char* p = s.rep->str;
    char c;

    // skip white spaces
    while( is.get( c ) && isspace( c ) )
        ;

    for( ; is.good() && ! isspace( c ); is.get( c ) ) {
        if( i > s.rep->alloc - 2 ) {
	    s.rep->str[i] = '\0';
            s.rep->resize( (int) (s.rep->alloc * 1.5) );
            p = s.rep->str + i;
        }
        *p ++ = c;
        i ++;
    }
    *p = '\0';

    return is;
}